

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astro.cpp
# Opt level: O3

UDate __thiscall icu_63::CalendarAstronomer::getSunRiseSet(CalendarAstronomer *this,UBool rise)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined4 uVar9;
  double dVar10;
  UDate UVar11;
  double dVar12;
  undefined4 uVar13;
  RiseSetCoordFunc func;
  CoordFunc local_20;
  
  dVar12 = this->fTime;
  dVar10 = uprv_floor_63((this->fGmtOffset + dVar12) / 86400000.0);
  this->fTime = (dVar10 * 86400000.0 - this->fGmtOffset) + 43200000.0 +
                *(double *)(&DAT_003264e0 + (ulong)(rise == '\0') * 8);
  dVar10 = uprv_getNaN_63();
  uVar9 = SUB84(dVar10,0);
  uVar13 = (undefined4)((ulong)dVar10 >> 0x20);
  auVar1._8_4_ = uVar9;
  auVar1._0_8_ = dVar10;
  auVar1._12_4_ = uVar13;
  this->sunLongitude = dVar10;
  this->meanAnomalySun = (double)auVar1._8_8_;
  auVar2._8_4_ = uVar9;
  auVar2._0_8_ = dVar10;
  auVar2._12_4_ = uVar13;
  this->julianDay = dVar10;
  this->julianCentury = (double)auVar2._8_8_;
  auVar3._8_4_ = uVar9;
  auVar3._0_8_ = dVar10;
  auVar3._12_4_ = uVar13;
  this->meanAnomalyMoon = dVar10;
  this->eclipObliquity = (double)auVar3._8_8_;
  auVar4._8_4_ = uVar9;
  auVar4._0_8_ = dVar10;
  auVar4._12_4_ = uVar13;
  this->moonLongitude = dVar10;
  this->moonEclipLong = (double)auVar4._8_8_;
  this->siderealTime = dVar10;
  this->siderealT0 = dVar10;
  this->moonPositionSet = '\0';
  local_20._vptr_CoordFunc = (_func_int **)&PTR_eval_003e4468;
  UVar11 = riseOrSet(this,&local_20,rise,0.009302604913129777,0.009890199094634533,5000.0);
  this->fTime = dVar12;
  dVar12 = uprv_getNaN_63();
  uVar9 = SUB84(dVar12,0);
  uVar13 = (undefined4)((ulong)dVar12 >> 0x20);
  auVar5._8_4_ = uVar9;
  auVar5._0_8_ = dVar12;
  auVar5._12_4_ = uVar13;
  this->sunLongitude = dVar12;
  this->meanAnomalySun = (double)auVar5._8_8_;
  auVar6._8_4_ = uVar9;
  auVar6._0_8_ = dVar12;
  auVar6._12_4_ = uVar13;
  this->julianDay = dVar12;
  this->julianCentury = (double)auVar6._8_8_;
  auVar7._8_4_ = uVar9;
  auVar7._0_8_ = dVar12;
  auVar7._12_4_ = uVar13;
  this->meanAnomalyMoon = dVar12;
  this->eclipObliquity = (double)auVar7._8_8_;
  auVar8._8_4_ = uVar9;
  auVar8._0_8_ = dVar12;
  auVar8._12_4_ = uVar13;
  this->moonLongitude = dVar12;
  this->moonEclipLong = (double)auVar8._8_8_;
  this->siderealTime = dVar12;
  this->siderealT0 = dVar12;
  this->moonPositionSet = '\0';
  return UVar11;
}

Assistant:

UDate CalendarAstronomer::getSunRiseSet(UBool rise)
{
    UDate t0 = fTime;

    // Make a rough guess: 6am or 6pm local time on the current day
    double noon = ClockMath::floorDivide(fTime + fGmtOffset, (double)DAY_MS)*DAY_MS - fGmtOffset + (12*HOUR_MS);

    U_DEBUG_ASTRO_MSG(("Noon=%.2lf, %sL, gmtoff %.2lf\n", noon, debug_astro_date(noon+fGmtOffset), fGmtOffset));
    setTime(noon +  ((rise ? -6 : 6) * HOUR_MS));
    U_DEBUG_ASTRO_MSG(("added %.2lf ms as a guess,\n", ((rise ? -6. : 6.) * HOUR_MS)));

    RiseSetCoordFunc func;
    double t = riseOrSet(func,
                         rise,
                         .533 * DEG_RAD,        // Angular Diameter
                         34. /60.0 * DEG_RAD,    // Refraction correction
                         MINUTE_MS / 12.);       // Desired accuracy

    setTime(t0);
    return t;
}